

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMap.hpp
# Opt level: O0

int __thiscall
MultiMap<long,_Server::Private::TimerImpl_*>::remove
          (MultiMap<long,_Server::Private::TimerImpl_*> *this,char *__filename)

{
  Item *pIVar1;
  Item *pIVar2;
  Item *pIVar3;
  code *pcVar4;
  int iVar5;
  Item *pIVar6;
  Item *pIVar7;
  Item *pIVar8;
  Item **local_a8;
  Item **local_a0;
  usize oldHeight_1;
  usize oldHeight;
  Item *prevLeft;
  Item *prevParent;
  Item *prev;
  Item *nextRight;
  Item *nextParent;
  Item *next;
  Item *right;
  Item *left;
  Item **cell;
  Item *parent;
  Item *origParent;
  Item *item;
  Iterator *it_local;
  MultiMap<long,_Server::Private::TimerImpl_*> *this_local;
  
  pIVar1 = *(Item **)__filename;
  pIVar7 = pIVar1->parent;
  if (pIVar7 == (Item *)0x0) {
    local_a8 = &this->root;
  }
  else {
    if (pIVar1 == pIVar7->left) {
      local_a0 = &pIVar7->left;
    }
    else {
      local_a0 = &pIVar7->right;
    }
    local_a8 = local_a0;
  }
  if ((*local_a8 != pIVar1) &&
     (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/../include/nstd/MultiMap.hpp"
                            ,0xb3,"*cell == item"), iVar5 != 0)) {
    pcVar4 = (code *)invalidInstructionException();
    (*pcVar4)();
  }
  pIVar8 = pIVar1->left;
  pIVar6 = pIVar1->right;
  cell = (Item **)pIVar7;
  if ((pIVar8 == (Item *)0x0) && (pIVar6 == (Item *)0x0)) {
    *local_a8 = (Item *)0x0;
  }
  else if (pIVar8 == (Item *)0x0) {
    *local_a8 = pIVar6;
    pIVar6->parent = pIVar7;
  }
  else if (pIVar6 == (Item *)0x0) {
    *local_a8 = pIVar8;
    pIVar8->parent = pIVar7;
  }
  else {
    if (pIVar8->height < pIVar6->height) {
      pIVar2 = pIVar1->next;
      if ((pIVar2->left != (Item *)0x0) &&
         (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/../include/nstd/MultiMap.hpp"
                                ,0xce,"!next->left"), iVar5 != 0)) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      cell = (Item **)pIVar2->parent;
      if ((Item *)cell == pIVar1) {
        if ((pIVar2 != pIVar6) &&
           (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/../include/nstd/MultiMap.hpp"
                                  ,0xd2,"next == right"), iVar5 != 0)) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *local_a8 = pIVar2;
        pIVar2->parent = pIVar7;
        pIVar2->left = pIVar8;
        pIVar8->parent = pIVar2;
        cell = (Item **)pIVar2;
      }
      else {
        if ((pIVar2 != ((Item *)cell)->left) &&
           (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/../include/nstd/MultiMap.hpp"
                                  ,0xdd,"next == nextParent->left"), iVar5 != 0)) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        pIVar3 = pIVar2->right;
        ((Item *)cell)->left = pIVar3;
        if (pIVar3 != (Item *)0x0) {
          pIVar3->parent = (Item *)cell;
        }
        *local_a8 = pIVar2;
        pIVar2->parent = pIVar7;
        pIVar2->left = pIVar8;
        pIVar8->parent = pIVar2;
        pIVar2->right = pIVar6;
        pIVar6->parent = pIVar2;
        if (((Item *)cell == (Item *)0x0) &&
           (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/../include/nstd/MultiMap.hpp"
                                  ,0xf1,"parent"), iVar5 != 0)) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
      }
    }
    else {
      pIVar2 = pIVar1->prev;
      if ((pIVar2->right != (Item *)0x0) &&
         (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/../include/nstd/MultiMap.hpp"
                                ,0xf7,"!prev->right"), iVar5 != 0)) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      cell = (Item **)pIVar2->parent;
      if ((Item *)cell == pIVar1) {
        if ((pIVar2 != pIVar8) &&
           (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/../include/nstd/MultiMap.hpp"
                                  ,0xfb,"prev == left"), iVar5 != 0)) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *local_a8 = pIVar2;
        pIVar2->parent = pIVar7;
        pIVar2->right = pIVar6;
        pIVar6->parent = pIVar2;
        cell = (Item **)pIVar2;
      }
      else {
        if ((pIVar2 != ((Item *)cell)->right) &&
           (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/../include/nstd/MultiMap.hpp"
                                  ,0x106,"prev == prevParent->right"), iVar5 != 0)) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        pIVar3 = pIVar2->left;
        ((Item *)cell)->right = pIVar3;
        if (pIVar3 != (Item *)0x0) {
          pIVar3->parent = (Item *)cell;
        }
        *local_a8 = pIVar2;
        pIVar2->parent = pIVar7;
        pIVar2->right = pIVar6;
        pIVar6->parent = pIVar2;
        pIVar2->left = pIVar8;
        pIVar8->parent = pIVar2;
        if (((Item *)cell == (Item *)0x0) &&
           (iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/../include/nstd/MultiMap.hpp"
                                  ,0x11a,"parent"), iVar5 != 0)) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
      }
    }
    do {
      pIVar8 = cell[5];
      Item::updateHeightAndSlope((Item *)cell);
      pIVar6 = rebal(this,(Item *)cell);
      if (pIVar8 == (Item *)pIVar6->height) {
        pIVar7 = *local_a8;
        Item::updateHeightAndSlope(pIVar7);
        pIVar7 = rebal(this,pIVar7);
        cell = (Item **)pIVar7->parent;
        break;
      }
      cell = (Item **)pIVar6->parent;
    } while ((Item *)cell != pIVar7);
  }
  do {
    if (cell == (Item **)0x0) {
LAB_00123a0c:
      if (pIVar1->prev == (Item *)0x0) {
        pIVar7 = pIVar1->next;
        (this->_begin).item = pIVar7;
        pIVar7->prev = (Item *)0x0;
      }
      else {
        pIVar7 = pIVar1->prev;
        pIVar8 = pIVar1->next;
        pIVar1->prev->next = pIVar8;
        pIVar8->prev = pIVar7;
      }
      this->_size = this->_size - 1;
      pIVar1->prev = this->freeItem;
      this->freeItem = pIVar1;
      Iterator::Iterator((Iterator *)&this_local,pIVar1->next);
      return (int)this_local;
    }
    pIVar7 = cell[5];
    Item::updateHeightAndSlope((Item *)cell);
    pIVar8 = rebal(this,(Item *)cell);
    if (pIVar7 == (Item *)pIVar8->height) goto LAB_00123a0c;
    cell = (Item **)pIVar8->parent;
  } while( true );
}

Assistant:

Iterator remove(const Iterator& it)
  {
    Item* item = it.item;
    Item* origParent;
    Item* parent = origParent = item->parent;
    Item** cell = parent ? (item == parent->left ? &parent->left : &parent->right) : &root;
    ASSERT(*cell == item);
    Item* left = item->left;
    Item* right = item->right;

    if(!left && !right)
    {
      *cell = 0;
      goto rebalParentUpwards;
    }

    if(!left)
    {
      *cell = right;
      right->parent = parent;
      goto rebalParentUpwards;
    }

    if(!right)
    {
      *cell = left;
      left->parent = parent;
      goto rebalParentUpwards;
    }

    if(left->height < right->height)
    {
      Item* next = item->next;
      ASSERT(!next->left);
      Item* nextParent = next->parent;
      if(nextParent == item)
      {
        ASSERT(next == right);
        *cell = next;
        next->parent = parent;

        next->left = left;
        left->parent = next;
        parent = next;
        goto rebalParent;
      }

      // unlink next
      ASSERT(next == nextParent->left);
      Item* nextRight = next->right;
      nextParent->left = nextRight;
      if(nextRight)
        nextRight->parent = nextParent;
      
      // put next in cell
      *cell = next;
      next->parent = parent;

      // link left to next left
      next->left = left;
      left->parent = next;

      // link right to next right
      next->right = right;
      right->parent = next;

      // rebal old next->parent
      parent = nextParent;
      ASSERT(parent);
      goto rebalParent;
    }
    else
    {
      Item* prev = item->prev;
      ASSERT(!prev->right);
      Item* prevParent = prev->parent;
      if(prevParent == item)
      {
        ASSERT(prev == left);
        *cell = prev;
        prev->parent = parent;

        prev->right = right;
        right->parent = prev;
        parent = prev;
        goto rebalParent;
      }

      // unlink prev
      ASSERT(prev == prevParent->right);
      Item* prevLeft = prev->left;
      prevParent->right = prevLeft;
      if(prevLeft)
        prevLeft->parent = prevParent;

      // put prev in cell
      *cell = prev;
      prev->parent = parent;

      // link right to prev right
      prev->right = right;
      right->parent = prev;

      // link left to prev left
      prev->left = left;
      left->parent = prev;

      // rebal old prev->parent
      parent = prevParent;
      ASSERT(parent);
      goto rebalParent;
    }

    // rebal parent upwards
  rebalParent:
    do
    {
      usize oldHeight = parent->height;
      parent->updateHeightAndSlope();
      parent = rebal(parent);
      if(oldHeight == parent->height)
      {
        parent = *cell;
        parent->updateHeightAndSlope();
        parent = rebal(parent);
        parent = parent->parent;
        break;
      }
      parent = parent->parent;
    } while(parent != origParent);
  rebalParentUpwards:
    while(parent)
    {
      usize oldHeight = parent->height;
      parent->updateHeightAndSlope();
      parent = rebal(parent);
      if(oldHeight == parent->height)
        break;
      parent = parent->parent;
    }

    if(!item->prev)
      (_begin.item = item->next)->prev = 0;
    else
      (item->prev->next = item->next)->prev = item->prev;
    --_size;

    item->~Item();
    item->prev = freeItem;
    freeItem = item;
    return item->next;
  }